

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp sexp_save_image(sexp ctx_in,char *filename)

{
  size_t sVar1;
  char *in_RSI;
  sexp in_RDI;
  sexp_image_header_t header;
  size_t size;
  size_t pad;
  sexp base;
  sexp ctx_out;
  FILE *fp;
  sexp res;
  sexp_heap_conflict heap;
  char local_78 [24];
  size_t local_60;
  char *local_58;
  sexp local_50;
  size_t local_48;
  long local_40;
  char *local_38;
  sexp local_30;
  FILE *local_28;
  sexp local_20;
  sexp_heap_conflict local_18;
  char *local_10;
  
  local_18 = (sexp_heap_conflict)0x0;
  local_20 = (sexp)0x0;
  local_10 = in_RSI;
  local_28 = fopen(in_RSI,"wb");
  if (local_28 == (FILE *)0x0) {
    snprintf(gc_heap_err_str,0x100,"Could not open image file for writing: %s",local_10);
  }
  else {
    local_30 = sexp_gc_heap_pack((sexp)fp,(sexp_uint_t)ctx_out);
    if (((local_30 != (sexp)0x0) && (((ulong)local_30 & 3) == 0)) && (local_30->tag == 0x24)) {
      local_18 = (local_30->value).context.heap;
      local_58 = local_18->data + 0x20;
      local_40 = (long)local_58 - (long)local_18->data;
      local_60 = local_18->size - local_40;
      builtin_strncpy(local_78,"\a\achibi\n\x01",10);
      builtin_strncpy(local_78 + 0xc,"cv-gm*uh",8);
      local_78[10] = '\x01';
      local_78[0xb] = '\0';
      local_50 = local_30;
      local_48 = local_60;
      local_38 = local_58;
      sVar1 = fwrite(local_78,0x30,1,local_28);
      if ((sVar1 == 1) && (sVar1 = fwrite(local_38,local_48,1,local_28), sVar1 == 1)) {
        local_20 = (sexp)&DAT_0000013e;
      }
      else {
        snprintf(gc_heap_err_str,0x100,"Error writing image file: %s",local_10);
      }
    }
  }
  if (local_28 != (FILE *)0x0) {
    fclose(local_28);
  }
  if (local_18 != (sexp_heap_conflict)0x0) {
    sexp_free_heap((sexp_heap_conflict)0x1320f1);
  }
  if (local_20 != (sexp)&DAT_0000013e) {
    local_20 = sexp_user_exception((sexp)header._16_8_,(sexp)header._8_8_,(char *)header.magic,
                                   in_RDI);
  }
  return local_20;
}

Assistant:

sexp sexp_save_image (sexp ctx_in, const char* filename) {
  sexp_heap heap = NULL;
  sexp res = NULL;
  FILE *fp = fopen(filename, "wb");
  if (!fp) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Could not open image file for writing: %s", filename);
    goto done;
  }
  
  /* Save ONLY packed, active SEXPs.  No free list structures or padding. */
  sexp ctx_out = sexp_gc_heap_pack(ctx_in, 0);
  if (!ctx_out || !sexp_contextp(ctx_out)) {
    goto done;
  }
  heap = sexp_context_heap(ctx_out);
  sexp   base = sexp_heap_first_block(heap);
  size_t pad  = (size_t)((unsigned char *)base - (unsigned char *)heap->data);
  size_t size = heap->size - pad;
  
  struct sexp_image_header_t header;
  memcpy(&header.magic, SEXP_IMAGE_MAGIC, sizeof(header.magic));
  memcpy(&header.abi, SEXP_ABI_IDENTIFIER, sizeof(header.abi));
  header.major   = SEXP_IMAGE_MAJOR_VERSION;
  header.minor   = SEXP_IMAGE_MINOR_VERSION;
  header.size    = size;
  header.base    = base;
  header.context = ctx_out;

  if (! (fwrite(&header, sizeof(header), 1, fp) == 1 &&
         fwrite(base, size, 1, fp) == 1)) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Error writing image file: %s", filename);
    goto done;
  }
  
  res = SEXP_TRUE;
done:
  if (fp) fclose(fp);
  if (heap) sexp_free_heap(heap);
  if (res != SEXP_TRUE) res = sexp_user_exception(ctx_in, NULL, gc_heap_err_str, SEXP_NULL);
  return res;
}